

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::Maybe<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>::
Maybe(Maybe<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>
      *this,Maybe<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>
            *other)

{
  byte bVar1;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = (bool)bVar1;
  if ((bool)bVar1 == true) {
    Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>::Maybe
              ((Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_> *)&(this->ptr).field_1.value,
               (Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_> *)&(other->ptr).field_1.value
              );
    (this->ptr).field_1.value.impl.super_TupleElement<1U,_bool>.value =
         (other->ptr).field_1.value.impl.super_TupleElement<1U,_bool>.value;
    (this->ptr).field_1.value.impl.super_TupleElement<2U,_bool>.value =
         (other->ptr).field_1.value.impl.super_TupleElement<2U,_bool>.value;
    bVar1 = (other->ptr).isSet;
  }
  if ((((bVar1 & 1) != 0) &&
      ((other->ptr).isSet = false,
      (other->ptr).field_1.value.impl.
      super_TupleElement<0U,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>_>.value.ptr.
      isSet == true)) && (*(long *)((long)&(other->ptr).field_1 + 0x10) != 0)) {
    capnp::_::OrphanBuilder::euthanize
              ((OrphanBuilder *)
               &(other->ptr).field_1.value.impl.
                super_TupleElement<0U,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>_>.
                value.ptr.field_1);
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }